

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_launcher.cpp
# Opt level: O0

void lscpp::launch(lsp_server *server,launch_config *config,transporter *transporter_)

{
  long lVar1;
  char *path_in;
  void *__stat_loc;
  undefined1 local_40 [8];
  future<void> rcv;
  lsp_message_handler message_handler;
  transporter *transporter__local;
  launch_config *config_local;
  lsp_server *server_local;
  
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&stack0xffffffffffffffd8,&config->startup_delay);
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
            ((duration<long,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffd8);
  memset((void *)((long)&rcv.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 5),0,3);
  lsp_message_handler::lsp_message_handler
            ((lsp_message_handler *)
             ((long)&rcv.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 5));
  loguru::g_stderr_verbosity = 0xfffffff7;
  loguru::g_colorlogtostderr = 0;
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    path_in = (char *)std::__cxx11::string::c_str();
    loguru::add_file(path_in,Truncate,(config->logger).verbosity);
  }
  __stat_loc = (void *)0x1;
  std::async<lscpp::launch(lscpp::lsp_server&&,lscpp::launch_config,lscpp::transporter&&)::__0>
            ((launch)(__basic_future<void> *)local_40,(type *)0x1);
  std::__basic_future<void>::wait((__basic_future<void> *)local_40,__stat_loc);
  std::future<void>::~future((future<void> *)local_40);
  return;
}

Assistant:

void launch(lsp_server &&server, launch_config config,
            transporter &&transporter_) {

  // Allows to attach a debugger,
  // before the language server starts to communicate with the client.
  std::this_thread::sleep_for(std::chrono::seconds(config.startup_delay));

  // If we want to play with different message handlers, we can revert to a
  // templated launch (or duplicate the launch as long as it is simple)
  lsp_message_handler message_handler{};

  // setup logger
  loguru::g_stderr_verbosity = loguru::Verbosity_OFF;
  loguru::g_colorlogtostderr = false;
  if (config.logger.filename.size() > 0)
    loguru::add_file(config.logger.filename.c_str(), loguru::Truncate,
                     config.logger.verbosity);

  auto rcv = std::async(std::launch::async, [&]() {
    while (true) {
      auto header = parse_header(transporter_);
      LOG_F(INFO, "content-length: '%d'", header.content_length);
      if (header.content_length <
          0) { // TODO parse header should not use -1 to report an error
        continue;
      }
      auto msg = transporter_.read_message(header.content_length);
      LOG_F(INFO, "msg: '%s'", msg.c_str());

      auto result = message_handler.handle_message(server, msg);
      if (result) {
        LOG_F(INFO, "Sending response: '%s'", (*result).c_str());
        write_lsp_message(transporter_, *result);
      }
    }
  });

  rcv.wait();
}